

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O0

void __thiscall CMU462::DynamicScene::Mesh::split_selected_edge(Mesh *this)

{
  Edge *this_00;
  _List_iterator<CMU462::Halfedge> *this_01;
  pointer this_02;
  VertexIter this_03;
  Vertex *pVVar1;
  long in_RDI;
  VertexIter v;
  Edge *edge;
  HalfedgeElement *element;
  HalfedgeMesh *in_stack_00000090;
  EdgeIter in_stack_00000098;
  HalfedgeElement *in_stack_ffffffffffffffc0;
  
  if (((*(long *)(in_RDI + 8) != 0) && (*(long *)(*(long *)(in_RDI + 8) + 0x38) != 0)) &&
     (this_00 = HalfedgeElement::getEdge(in_stack_ffffffffffffffc0), this_00 != (Edge *)0x0)) {
    this_01 = (_List_iterator<CMU462::Halfedge> *)(in_RDI + 0xf0);
    Edge::halfedge(this_00);
    this_02 = std::_List_iterator<CMU462::Halfedge>::operator->(this_01);
    Halfedge::edge(this_02);
    this_03 = HalfedgeMesh::splitEdge(in_stack_00000090,in_stack_00000098);
    pVVar1 = elementAddress((VertexIter)0x200e04);
    *(Vertex **)(*(long *)(in_RDI + 8) + 0x38) = pVVar1;
    Selection::clear((Selection *)this_03._M_node);
    Selection::clear((Selection *)this_03._M_node);
  }
  return;
}

Assistant:

void Mesh::split_selected_edge() {
  if (scene == nullptr) return;
  HalfedgeElement *element = scene->selected.element;
  if (element == nullptr) return;
  Edge *edge = element->getEdge();
  if (edge == nullptr) return;
  VertexIter v = mesh.splitEdge(edge->halfedge()->edge());
  scene->selected.element = elementAddress(v);
  scene->hovered.clear();
  scene->elementTransform->target.clear();
}